

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O0

RequireResult __thiscall
duckdb::SQLLogicTestRunner::CheckRequire
          (SQLLogicTestRunner *this,SQLLogicParser *parser,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *params)

{
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  idx_t iVar4;
  long lVar5;
  pointer pDVar6;
  type pDVar7;
  const_reference pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar9;
  ExtensionLoadResult result;
  char **ext;
  char **__end1;
  char **__begin1;
  char *(*__range1) [23];
  bool excluded_from_autoloading;
  string explanation;
  size_t index;
  char *verify_vector;
  unsigned_long required_block_size;
  unsigned_long required_vector_size_1;
  unsigned_long required_vector_size;
  optional_idx available_space;
  idx_t required_limit_1;
  optional_idx limit;
  idx_t required_limit;
  string param;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  value_type *in_stack_fffffffffffffb78;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb80;
  allocator *paVar10;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  SQLLogicParser *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  undefined7 in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  SQLLogicParser *in_stack_fffffffffffffbd0;
  size_t *in_stack_fffffffffffffc28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffc30;
  undefined7 in_stack_fffffffffffffc38;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_260;
  undefined1 local_258;
  char local_249;
  pointer_____offset_0x10___ *local_248;
  pointer_____offset_0x10___ *local_240;
  pointer_____offset_0x10___ *local_238;
  undefined **local_230;
  byte local_222;
  allocator local_221;
  string local_220 [32];
  string local_200 [32];
  undefined8 local_1e0;
  allocator local_1d1;
  string local_1d0 [32];
  char *local_1b0;
  unsigned_long local_1a8;
  allocator local_199;
  string local_198 [32];
  unsigned_long local_178;
  allocator local_169;
  string local_168 [32];
  unsigned_long local_148;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  optional_idx local_f0;
  ulong local_e8;
  allocator local_d9;
  string local_d8 [32];
  optional_idx local_b8;
  ulong local_b0;
  allocator local_a1;
  string local_a0 [36];
  undefined4 local_7c;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  RequireResult local_4;
  
  local_20 = in_RDX;
  sVar3 = Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"require requires a single parameter",&local_41);
    SQLLogicParser::Fail<>
              (in_stack_fffffffffffffba0,
               (string *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_fffffffffffffb70,(size_type)in_stack_fffffffffffffb68);
  duckdb::StringUtil::Lower(local_78);
  bVar1 = std::operator==(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
  if (bVar1) {
    local_4 = PRESENT;
    local_7c = 1;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
    if (bVar1) {
      local_4 = PRESENT;
      local_7c = 1;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
      if (bVar1) {
        local_4 = MISSING;
        local_7c = 1;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
        if (bVar1) {
          local_4 = PRESENT;
          local_7c = 1;
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
          if (bVar1) {
            local_4 = MISSING;
            local_7c = 1;
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
            if (bVar1) {
              local_4 = MISSING;
              local_7c = 1;
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
              if (bVar1) {
                local_4 = PRESENT;
                local_7c = 1;
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68)
                ;
                if (bVar1) {
                  bVar1 = TestForceStorage();
                  if (bVar1) {
                    local_4 = MISSING;
                    local_7c = 1;
                  }
                  else {
                    local_4 = PRESENT;
                    local_7c = 1;
                  }
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                          (char *)in_stack_fffffffffffffb68);
                  if (bVar1) {
                    local_4 = PRESENT;
                    local_7c = 1;
                  }
                  else {
                    bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                            (char *)in_stack_fffffffffffffb68);
                    if (bVar1) {
                      local_4 = PRESENT;
                      local_7c = 1;
                    }
                    else {
                      bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                              (char *)in_stack_fffffffffffffb68);
                      if (bVar1) {
                        sVar3 = Catch::clara::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size(local_20);
                        if (sVar3 != 2) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_a0,"require ram requires a parameter",&local_a1);
                          SQLLogicParser::Fail<>
                                    (in_stack_fffffffffffffba0,
                                     (string *)
                                     CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
                          std::__cxx11::string::~string(local_a0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
                        }
                        pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                               *)in_stack_fffffffffffffb70,
                                              (size_type)in_stack_fffffffffffffb68);
                        local_b0 = duckdb::DBConfig::ParseMemoryLimit((string *)pvVar8);
                        local_b8.index = duckdb::FileSystem::GetAvailableMemory();
                        bVar1 = optional_idx::IsValid(&local_b8);
                        if (bVar1) {
                          iVar4 = optional_idx::GetIndex
                                            ((optional_idx *)
                                             CONCAT17(in_stack_fffffffffffffbb7,
                                                      in_stack_fffffffffffffbb0));
                          if (iVar4 < local_b0) {
                            local_4 = MISSING;
                            local_7c = 1;
                          }
                          else {
                            local_4 = PRESENT;
                            local_7c = 1;
                          }
                        }
                        else {
                          local_4 = MISSING;
                          local_7c = 1;
                        }
                      }
                      else {
                        bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                                (char *)in_stack_fffffffffffffb68);
                        if (bVar1) {
                          sVar3 = Catch::clara::std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::size(local_20);
                          if (sVar3 != 2) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_d8,"require disk_space requires a parameter",&local_d9)
                            ;
                            SQLLogicParser::Fail<>
                                      (in_stack_fffffffffffffba0,
                                       (string *)
                                       CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98)
                                      );
                            std::__cxx11::string::~string(local_d8);
                            std::allocator<char>::~allocator((allocator<char> *)&local_d9);
                          }
                          pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                                 *)in_stack_fffffffffffffb70,
                                                (size_type)in_stack_fffffffffffffb68);
                          local_e8 = duckdb::DBConfig::ParseMemoryLimit((string *)pvVar8);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_110,".",&local_111);
                          local_f0.index = duckdb::FileSystem::GetAvailableDiskSpace(local_110);
                          std::__cxx11::string::~string(local_110);
                          std::allocator<char>::~allocator((allocator<char> *)&local_111);
                          bVar1 = optional_idx::IsValid(&local_f0);
                          if (bVar1) {
                            iVar4 = optional_idx::GetIndex
                                              ((optional_idx *)
                                               CONCAT17(in_stack_fffffffffffffbb7,
                                                        in_stack_fffffffffffffbb0));
                            if (iVar4 < local_e8) {
                              local_4 = MISSING;
                              local_7c = 1;
                            }
                            else {
                              local_4 = PRESENT;
                              local_7c = 1;
                            }
                          }
                          else {
                            local_4 = MISSING;
                            local_7c = 1;
                          }
                        }
                        else {
                          bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                                  (char *)in_stack_fffffffffffffb68);
                          if (bVar1) {
                            sVar3 = Catch::clara::std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::size(local_20);
                            if (sVar3 != 2) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_138,"require vector_size requires a parameter",
                                         &local_139);
                              SQLLogicParser::Fail<>
                                        (in_stack_fffffffffffffba0,
                                         (string *)
                                         CONCAT17(in_stack_fffffffffffffb9f,
                                                  in_stack_fffffffffffffb98));
                              std::__cxx11::string::~string(local_138);
                              std::allocator<char>::~allocator((allocator<char> *)&local_139);
                            }
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                          *)in_stack_fffffffffffffb70,
                                         (size_type)in_stack_fffffffffffffb68);
                            std::__cxx11::stoi(in_stack_fffffffffffffb70,
                                               (size_t *)in_stack_fffffffffffffb68,0);
                            local_148 = NumericCast<unsigned_long,int,void>(0);
                            if (local_148 < 0x801) {
                              local_4 = PRESENT;
                              local_7c = 1;
                            }
                            else {
                              local_4 = MISSING;
                              local_7c = 1;
                            }
                          }
                          else {
                            bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                                    (char *)in_stack_fffffffffffffb68);
                            if (bVar1) {
                              sVar3 = Catch::clara::std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::size(local_20);
                              if (sVar3 != 2) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_168,
                                           "require exact_vector_size requires a parameter",
                                           &local_169);
                                SQLLogicParser::Fail<>
                                          (in_stack_fffffffffffffba0,
                                           (string *)
                                           CONCAT17(in_stack_fffffffffffffb9f,
                                                    in_stack_fffffffffffffb98));
                                std::__cxx11::string::~string(local_168);
                                std::allocator<char>::~allocator((allocator<char> *)&local_169);
                              }
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                            *)in_stack_fffffffffffffb70,
                                           (size_type)in_stack_fffffffffffffb68);
                              std::__cxx11::stoi(in_stack_fffffffffffffb70,
                                                 (size_t *)in_stack_fffffffffffffb68,0);
                              local_178 = NumericCast<unsigned_long,int,void>(0);
                              if (local_178 == 0x800) {
                                local_4 = PRESENT;
                                local_7c = 1;
                              }
                              else {
                                local_4 = MISSING;
                                local_7c = 1;
                              }
                            }
                            else {
                              uVar2 = std::operator==(in_stack_fffffffffffffb70,
                                                      (char *)in_stack_fffffffffffffb68);
                              if ((bool)uVar2) {
                                sVar3 = Catch::clara::std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::size(local_20);
                                if (sVar3 != 2) {
                                  paVar10 = &local_199;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            (local_198,"require block_size requires a parameter",
                                             paVar10);
                                  SQLLogicParser::Fail<>
                                            (in_stack_fffffffffffffba0,
                                             (string *)
                                             CONCAT17(in_stack_fffffffffffffb9f,
                                                      in_stack_fffffffffffffb98));
                                  std::__cxx11::string::~string(local_198);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_199);
                                }
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                              *)in_stack_fffffffffffffb70,
                                             (size_type)in_stack_fffffffffffffb68);
                                std::__cxx11::stoi(in_stack_fffffffffffffb70,
                                                   (size_t *)in_stack_fffffffffffffb68,0);
                                local_1a8 = NumericCast<unsigned_long,int,void>(0);
                                pDVar6 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                                         ::operator->((
                                                  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                                                  *)in_stack_fffffffffffffb70);
                                if (*(unsigned_long *)(pDVar6 + 0x430) == local_1a8) {
                                  local_4 = PRESENT;
                                  local_7c = 1;
                                }
                                else {
                                  local_4 = MISSING;
                                  local_7c = 1;
                                }
                              }
                              else {
                                bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                                        (char *)in_stack_fffffffffffffb68);
                                if (bVar1) {
                                  *(undefined1 *)(in_RDI + 0xf3) = 1;
                                  local_4 = PRESENT;
                                  local_7c = 1;
                                }
                                else {
                                  bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                                          (char *)in_stack_fffffffffffffb68);
                                  if (bVar1) {
                                    local_4 = PRESENT;
                                    local_7c = 1;
                                  }
                                  else {
                                    bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                                            (char *)in_stack_fffffffffffffb68);
                                    if (bVar1) {
                                      local_4 = PRESENT;
                                      local_7c = 1;
                                    }
                                    else {
                                      bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                                              (char *)in_stack_fffffffffffffb68);
                                      if (bVar1) {
                                        local_1b0 = getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
                                        if (local_1b0 == (char *)0x0) {
                                          local_4 = PRESENT;
                                          local_7c = 1;
                                        }
                                        else {
                                          local_4 = MISSING;
                                          local_7c = 1;
                                        }
                                      }
                                      else {
                                        bVar1 = std::operator==(in_stack_fffffffffffffb70,
                                                                (char *)in_stack_fffffffffffffb68);
                                        if (bVar1) {
                                          sVar3 = Catch::clara::std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(local_20);
                                          if (sVar3 < 2) {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      (local_1d0,
                                                                                                              
                                                  "require no_extension_autoloading needs an explanation string"
                                                  ,&local_1d1);
                                            SQLLogicParser::Fail<>
                                                      (in_stack_fffffffffffffba0,
                                                       (string *)
                                                       CONCAT17(in_stack_fffffffffffffb9f,
                                                                in_stack_fffffffffffffb98));
                                            std::__cxx11::string::~string(local_1d0);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_1d1);
                                          }
                                          local_1e0 = 1;
                                          ParseExplanation((SQLLogicParser *)
                                                           CONCAT17(uVar2,in_stack_fffffffffffffc38)
                                                           ,in_stack_fffffffffffffc30,
                                                           in_stack_fffffffffffffc28);
                                          lVar5 = std::__cxx11::string::rfind
                                                            ((char *)local_200,0x8c0674);
                                          if ((lVar5 != 0) &&
                                             (lVar5 = std::__cxx11::string::rfind
                                                                ((char *)local_200,0x8c067d),
                                             lVar5 != 0)) {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      (local_220,
                                                                                                              
                                                  "require no_extension_autoloading explanation string should begin with either \'EXPECTED\' or FIXME\'"
                                                  ,&local_221);
                                            SQLLogicParser::Fail<>
                                                      (in_stack_fffffffffffffba0,
                                                       (string *)
                                                       CONCAT17(in_stack_fffffffffffffb9f,
                                                                in_stack_fffffffffffffb98));
                                            std::__cxx11::string::~string(local_220);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_221);
                                          }
                                          pDVar6 = 
                                                  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                                                  ::operator->((
                                                  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                                                  *)in_stack_fffffffffffffb70);
                                          local_4 = (RequireResult)(((byte)pDVar6[0xe2] & 1) != 0);
                                          local_7c = 1;
                                          std::__cxx11::string::~string(local_200);
                                        }
                                        else {
                                          uVar2 = std::operator==(in_stack_fffffffffffffb70,
                                                                  (char *)in_stack_fffffffffffffb68)
                                          ;
                                          if ((bool)uVar2) {
                                            pDVar6 = 
                                                  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                                                  ::operator->((
                                                  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                                                  *)in_stack_fffffffffffffb70);
                                            if (((byte)pDVar6[0x350] & 1) == 0) {
                                              local_4 = MISSING;
                                              local_7c = 1;
                                            }
                                            else {
                                              local_4 = PRESENT;
                                              local_7c = 1;
                                            }
                                          }
                                          else {
                                            local_222 = 1;
                                            local_230 = &AUTOLOADABLE_EXTENSIONS;
                                            local_240 = &Command::typeinfo;
                                            for (local_238 = &AUTOLOADABLE_EXTENSIONS;
                                                local_238 != local_240; local_238 = local_238 + 1) {
                                              local_248 = local_238;
                                              bVar1 = std::operator==((char *)
                                                  in_stack_fffffffffffffb70,
                                                  in_stack_fffffffffffffb68);
                                              if (bVar1) {
                                                local_222 = 0;
                                                break;
                                              }
                                            }
                                            pDVar6 = 
                                                  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                                                  ::operator->((
                                                  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                                                  *)in_stack_fffffffffffffb70);
                                            if (((byte)pDVar6[0xe2] & 1) == 0) {
                                              pDVar7 = 
                                                  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>
                                                  ::operator*((
                                                  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>
                                                  *)in_stack_fffffffffffffb70);
                                              local_249 = duckdb::ExtensionHelper::LoadExtension
                                                                    (pDVar7,local_78);
                                              if (local_249 == '\0') {
                                                pVar9 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::insert(in_stack_fffffffffffffb80,
                                                           in_stack_fffffffffffffb78);
                                                local_260._M_cur =
                                                     (__node_type *)
                                                     pVar9.first.
                                                                                                          
                                                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                                  ._M_cur;
                                                local_258 = pVar9.second;
                                              }
                                              else if (local_249 == '\x01') {
                                                paVar10 = &local_281;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          (local_280,"unknown extension type: %s",
                                                           paVar10);
                                                pvVar8 = 
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                                  *)in_stack_fffffffffffffb70,
                                                  (size_type)in_stack_fffffffffffffb68);
                                                std::__cxx11::string::string
                                                          (local_2a8,(string *)pvVar8);
                                                SQLLogicParser::Fail<std::__cxx11::string>
                                                          (in_stack_fffffffffffffbd0,
                                                           in_stack_fffffffffffffbc8,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar2,in_stack_fffffffffffffbc0));
                                                std::__cxx11::string::~string(local_2a8);
                                                std::__cxx11::string::~string(local_280);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_281);
                                              }
                                              else if (local_249 == '\x02') {
                                                local_4 = MISSING;
                                                local_7c = 1;
                                                goto LAB_007cec42;
                                              }
                                            }
                                            else if ((local_222 & 1) != 0) {
                                              local_4 = MISSING;
                                              local_7c = 1;
                                              goto LAB_007cec42;
                                            }
                                            local_4 = PRESENT;
                                            local_7c = 1;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_007cec42:
  std::__cxx11::string::~string(local_78);
  return local_4;
}

Assistant:

RequireResult SQLLogicTestRunner::CheckRequire(SQLLogicParser &parser, const vector<string> &params) {
	if (params.size() < 1) {
		parser.Fail("require requires a single parameter");
	}
	// require command
	string param = StringUtil::Lower(params[0]);
	// os specific stuff

	if (param == "notmusl") {
#ifdef __MUSL_ENABLED__
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}
	if (param == "notmingw") {
#ifdef __MINGW32__
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "mingw") {
#ifndef __MINGW32__
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "notwindows") {
#ifdef _WIN32
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "windows") {
#ifndef _WIN32
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "longdouble") {
#if LDBL_MANT_DIG < 54
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "64bit") {
		if (sizeof(void *) != 8) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "noforcestorage") {
		if (TestForceStorage()) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "nothreadsan") {
#ifdef DUCKDB_THREAD_SANITIZER
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "strinline") {
#ifdef DUCKDB_DEBUG_NO_INLINE
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "ram") {
		if (params.size() != 2) {
			parser.Fail("require ram requires a parameter");
		}
		// require a minimum amount of ram
		auto required_limit = DBConfig::ParseMemoryLimit(params[1]);
		auto limit = FileSystem::GetAvailableMemory();
		if (!limit.IsValid()) {
			return RequireResult::MISSING;
		}
		if (limit.GetIndex() < required_limit) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "disk_space") {
		if (params.size() != 2) {
			parser.Fail("require disk_space requires a parameter");
		}
		// require a minimum amount of disk space
		auto required_limit = DBConfig::ParseMemoryLimit(params[1]);
		auto available_space = FileSystem::GetAvailableDiskSpace(".");
		if (!available_space.IsValid()) {
			return RequireResult::MISSING;
		}
		if (available_space.GetIndex() < required_limit) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "vector_size") {
		if (params.size() != 2) {
			parser.Fail("require vector_size requires a parameter");
		}
		// require a specific vector size
		auto required_vector_size = NumericCast<idx_t>(std::stoi(params[1]));
		if (STANDARD_VECTOR_SIZE < required_vector_size) {
			// vector size is too low for this test: skip it
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "exact_vector_size") {
		if (params.size() != 2) {
			parser.Fail("require exact_vector_size requires a parameter");
		}
		// require an exact vector size
		auto required_vector_size = NumericCast<idx_t>(std::stoi(params[1]));
		if (STANDARD_VECTOR_SIZE != required_vector_size) {
			// vector size does not match the required vector size: skip it
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "block_size") {
		if (params.size() != 2) {
			parser.Fail("require block_size requires a parameter");
		}
		// require a specific block size
		auto required_block_size = NumericCast<idx_t>(std::stoi(params[1]));
		if (config->options.default_block_alloc_size != required_block_size) {
			// block size does not match the required block size: skip it
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "skip_reload") {
		skip_reload = true;
		return RequireResult::PRESENT;
	}

	if (param == "no_alternative_verify") {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "no_block_verification") {
#ifdef DUCKDB_BLOCK_VERIFICATION
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "no_vector_verification") {
		auto verify_vector = std::getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
		if (verify_vector) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}
	if (param == "no_extension_autoloading") {
		if (params.size() < 2) {
			parser.Fail("require no_extension_autoloading needs an explanation string");
		}
		size_t index = 1;
		string explanation = ParseExplanation(parser, params, index);
		if (explanation.rfind("EXPECTED", 0) == 0 || explanation.rfind("FIXME", 0) == 0) {
			// good, explanation is properly formatted
		} else {
			parser.Fail(
			    "require no_extension_autoloading explanation string should begin with either 'EXPECTED' or FIXME'");
		}
		if (config->options.autoload_known_extensions) {
			// If autoloading is on, we skip this test
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}
	if (param == "allow_unsigned_extensions") {
		if (config->options.allow_unsigned_extensions) {
			return RequireResult::PRESENT;
		}
		return RequireResult::MISSING;
	}

	bool excluded_from_autoloading = true;
	for (const auto &ext : AUTOLOADABLE_EXTENSIONS) {
		if (ext == param) {
			excluded_from_autoloading = false;
			break;
		}
	}

	if (!config->options.autoload_known_extensions) {
		auto result = ExtensionHelper::LoadExtension(*db, param);
		if (result == ExtensionLoadResult::LOADED_EXTENSION) {
			// add the extension to the list of loaded extensions
			extensions.insert(param);
		} else if (result == ExtensionLoadResult::EXTENSION_UNKNOWN) {
			parser.Fail("unknown extension type: %s", params[0]);
		} else if (result == ExtensionLoadResult::NOT_LOADED) {
			// extension known but not build: skip this test
			return RequireResult::MISSING;
		}
	} else if (excluded_from_autoloading) {
		return RequireResult::MISSING;
	}
	return RequireResult::PRESENT;
}